

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O2

void * __thiscall
MultiANN::NearestNeighbor(MultiANN *this,ANNpoint *x,int *best_idx,double *best_dist)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  ANNpoint pAVar7;
  ANNpoint pAVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_80;
  double local_78;
  int *local_70;
  double *local_68;
  double local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  
  iVar9 = 0;
  local_78 = INFINITY;
  local_70 = best_idx;
  local_68 = best_dist;
  for (uVar10 = 0x1e; 3 < uVar10; uVar10 = uVar10 - 1) {
    if (this->AnnArray[uVar10] != (ANN *)0x0) {
      local_80 = 0.0;
      iVar9 = ANN::NearestNeighbor(this->AnnArray[uVar10],this->topology,this->scaling,x,&local_80);
      if (local_80 < local_78) {
        *local_70 = iVar9;
        local_78 = local_80;
      }
      iVar9 = ANN::LastNode(this->AnnArray[uVar10]);
      iVar9 = (uint)(iVar9 != this->size) + iVar9;
    }
  }
  for (lVar11 = (long)iVar9; this->size != (int)lVar11; lVar11 = lVar11 + 1) {
    pAVar7 = this->points_coor[lVar11];
    local_80 = 0.0;
    dVar13 = 0.0;
    iVar9 = 0;
    while (iVar9 < this->dimension) {
      iVar6 = this->topology[iVar9];
      if (iVar6 == 3) {
        dVar13 = pAVar7[iVar9];
        pAVar8 = *x;
        dVar14 = pAVar8[iVar9];
        dVar15 = pAVar7[(long)iVar9 + 1];
        dVar1 = pAVar7[(long)iVar9 + 2];
        dVar2 = pAVar8[(long)iVar9 + 1];
        dVar3 = pAVar8[(long)iVar9 + 2];
        dVar4 = pAVar7[(long)iVar9 + 3];
        dVar5 = pAVar8[(long)iVar9 + 3];
        local_58 = dVar4 * dVar5 + dVar1 * dVar3 + dVar13 * dVar14 + dVar15 * dVar2;
        if (1.0 < local_58) {
          local_58 = local_58 /
                     ((dVar5 * dVar5 + dVar3 * dVar3 + dVar14 * dVar14 + dVar2 * dVar2) *
                     (dVar4 * dVar4 + dVar1 * dVar1 + dVar13 * dVar13 + dVar15 * dVar15));
        }
        uStack_50 = 0;
        iVar12 = iVar9 + 3;
        local_60 = acos(local_58);
        local_48 = -local_58;
        uStack_40 = uStack_50 ^ 0x8000000000000000;
        dVar13 = acos(local_48);
        dVar13 = acos((double)(~-(ulong)(dVar13 < local_60) & (ulong)local_58 |
                              (ulong)local_48 & -(ulong)(dVar13 < local_60)));
        dVar13 = dVar13 * this->scaling[iVar9];
        dVar13 = dVar13 * dVar13 + local_80;
        local_80 = dVar13;
      }
      else {
        iVar12 = iVar9;
        if (iVar6 == 2) {
          dVar15 = ABS(pAVar7[iVar9] - (*x)[iVar9]);
          dVar14 = 6.283185307179586 - dVar15;
          if (dVar15 <= 6.283185307179586 - dVar15) {
            dVar14 = dVar15;
          }
          dVar14 = dVar14 * this->scaling[iVar9];
          dVar13 = dVar13 + dVar14 * dVar14;
          local_80 = dVar13;
        }
        else if (iVar6 == 1) {
          dVar14 = (pAVar7[iVar9] - (*x)[iVar9]) * this->scaling[iVar9];
          dVar13 = dVar13 + dVar14 * dVar14;
          local_80 = dVar13;
        }
      }
      iVar9 = iVar12 + 1;
    }
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    if (dVar13 < local_78) {
      *local_70 = (int)lVar11;
      local_78 = dVar13;
    }
  }
  *local_68 = local_78;
  return this->points_ptr[*local_70];
}

Assistant:

void *MultiANN::NearestNeighbor(  // 1-nearest neighbor query
    const ANNpoint &x,            // query point
    int &best_idx,      // index of the nearest neighbor to x (returned)
    double &best_dist)  // distance from the nearest neighbor to x (returned)
{
    int n, n_last;
    int k;
    double d, d_min;

    n = n_last = 0;  // Keeps the warnings away
    d_min = INFINITY;
    d = 0.0;

    for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX;
         k--) {             // Find the nearest neighbor
        if (AnnArray[k]) {  // First check the ANN trees
            d = 0.0;
            n = AnnArray[k]->NearestNeighbor(topology, scaling, x, d);
            if (d < d_min) {
                d_min = d;
                best_idx = n;
            }
            n_last = AnnArray[k]->LastNode();
            if (n_last != size) n_last++;
        }
    }

    for (n = n_last; n != size;
         n++) {  // Check the new nodes, which are not yet in the ANN tree
        ANNpoint x1 = points_coor[n];
        d = 0.0;
        for (int i = 0; i < dimension; i++) {
            if (topology[i] == 1) {
                d += ANN_POW(scaling[i] * (x1[i] - x[i]));
            } else if (topology[i] == 2) {
                double t = fabs(x1[i] - x[i]);
                double t1 = ANN_MIN(t, 2.0 * PI - t);
                d += ANN_POW(scaling[i] * t1);
            } else if (topology[i] == 3) {
                double fd = x1[i] * x[i] + x1[i + 1] * x[i + 1] +
                            x1[i + 2] * x[i + 2] + x1[i + 3] * x[i + 3];
                if (fd > 1) {
                    double norm1 = x1[i] * x1[i] + x1[i + 1] * x1[i + 1] +
                                   x1[i + 2] * x1[i + 2] +
                                   x1[i + 3] * x1[i + 3];
                    double norm2 = x[i] * x[i] + x[i + 1] * x[i + 1] +
                                   x[i + 2] * x[i + 2] + x[i + 3] * x[i + 3];
                    fd = fd / (norm1 * norm2);
                }
                double dtheta = ANN_MIN(acos(fd), acos(-fd));
                d += ANN_POW(scaling[i] * dtheta);
                i = i + 3;
            }
        }
        d = sqrt(d);
        if (d < d_min) {
            d_min = d;
            best_idx = n;
        }
    }

    best_dist = d_min;
    return points_ptr[best_idx];
}